

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcWorkSchedule,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcWorkControl *this;
  
  this = (IfcWorkControl *)operator_new(0x228);
  *(undefined ***)&this->field_0x210 = &PTR__Object_008d12a0;
  *(undefined8 *)(this + 1) = 0;
  *(char **)&this[1].field_0x8 = "IfcWorkSchedule";
  Assimp::IFC::Schema_2x3::IfcWorkControl::IfcWorkControl
            (this,&PTR_construction_vtable_24__009297a0);
  *(undefined ***)this = &PTR__IfcWorkSchedule_00929698;
  *(undefined ***)&this->field_0x210 = &PTR__IfcWorkSchedule_00929788;
  *(undefined ***)&this->field_0x88 = &PTR__IfcWorkSchedule_009296c0;
  *(undefined ***)&this->field_0x98 = &PTR__IfcWorkSchedule_009296e8;
  *(undefined ***)&this->field_0xd0 = &PTR__IfcWorkSchedule_00929710;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWorkControl,_10UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcWorkSchedule_00929738;
  *(undefined ***)&this->field_0x200 = &PTR__IfcWorkSchedule_00929760;
  GenericFill<Assimp::IFC::Schema_2x3::IfcWorkSchedule>(db,params,(IfcWorkSchedule *)this);
  return (Object *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }